

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_DeleteSubscriptions
               (UA_Server *server,UA_Session *session,UA_DeleteSubscriptionsRequest *request,
               UA_DeleteSubscriptionsResponse *response)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  void *dst;
  UA_DelayedJob *pUVar4;
  ulong uVar5;
  
  sVar1 = request->subscriptionIdsSize;
  if (sVar1 == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    pUVar3 = (UA_StatusCode *)malloc(sVar1 * 4);
    response->results = pUVar3;
    if (pUVar3 == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = sVar1;
      if (request->subscriptionIdsSize != 0) {
        uVar5 = 0;
        do {
          UVar2 = UA_Session_deleteSubscription(server,session,request->subscriptionIds[uVar5]);
          response->results[uVar5] = UVar2;
          uVar5 = uVar5 + 1;
        } while (uVar5 < request->subscriptionIdsSize);
      }
      if ((session->serverSubscriptions).lh_first == (UA_Subscription *)0x0) {
        dst = calloc(1,0x18);
        if (dst != (void *)0x0) {
          UA_copy(&session->authenticationToken,dst,UA_TYPES + 0x10);
          pUVar4 = (UA_DelayedJob *)malloc(0x28);
          if (pUVar4 != (UA_DelayedJob *)0x0) {
            (pUVar4->job).type = UA_JOBTYPE_METHODCALL;
            (pUVar4->job).job.methodCall.data = dst;
            (pUVar4->job).job.methodCall.method =
                 UA_Subscription_answerPublishRequestsNoSubscription;
            (pUVar4->next).sle_next = (server->delayedCallbacks).slh_first;
            (server->delayedCallbacks).slh_first = pUVar4;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
Service_DeleteSubscriptions(UA_Server *server, UA_Session *session,
                            const UA_DeleteSubscriptionsRequest *request,
                            UA_DeleteSubscriptionsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteSubscriptionsRequest");

    if(request->subscriptionIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->subscriptionIdsSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->subscriptionIdsSize;

    for(size_t i = 0; i < request->subscriptionIdsSize; ++i) {
        response->results[i] = UA_Session_deleteSubscription(server, session, request->subscriptionIds[i]);
        if(response->results[i] == UA_STATUSCODE_GOOD) {
            UA_LOG_DEBUG_SESSION(server->config.logger, session, "Subscription %u | "
                                "Subscription deleted", request->subscriptionIds[i]);
        } else {
            UA_LOG_DEBUG_SESSION(server->config.logger, session, "Deleting Subscription with Id "
                                 "%u failed with error code 0x%08x", request->subscriptionIds[i],
                                 response->results[i]);
        }
    }

    /* Send dangling publish responses in a delayed job if the last subscription
       was removed */
    if(LIST_FIRST(&session->serverSubscriptions))
        return;
    UA_NodeId *sessionToken = UA_NodeId_new();
    if(!sessionToken)
        return;
    UA_NodeId_copy(&session->authenticationToken, sessionToken);
    UA_Server_delayedCallback(server, (UA_ServerCallback)UA_Subscription_answerPublishRequestsNoSubscription,
                              sessionToken);
}